

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc_sse2.c
# Opt level: O0

void aom_highbd_comp_avg_upsampled_pred_sse2
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               uint8_t *pred8,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,
               int ref_stride,int bd,int subpel_search)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_R9;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  __m128i p0;
  __m128i s0;
  int i;
  int n;
  uint16_t *comp_pred16;
  uint16_t *pred;
  uint8_t *in_stack_0000a158;
  MV *in_stack_0000a160;
  int in_stack_0000a168;
  int in_stack_0000a16c;
  AV1Common *in_stack_0000a170;
  MACROBLOCKD *in_stack_0000a178;
  int in_stack_0000a250;
  int in_stack_0000a258;
  int in_stack_0000a260;
  int in_stack_0000a268;
  uint8_t *in_stack_0000a270;
  int in_stack_0000a278;
  int in_stack_0000a280;
  int in_stack_0000a288;
  int local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  undefined2 local_38;
  undefined2 uStack_36;
  undefined2 uStack_34;
  undefined2 uStack_32;
  undefined2 uStack_30;
  undefined2 uStack_2e;
  undefined2 uStack_2c;
  undefined2 uStack_2a;
  
  aom_highbd_upsampled_pred_sse2
            (in_stack_0000a178,in_stack_0000a170,in_stack_0000a16c,in_stack_0000a168,
             in_stack_0000a160,in_stack_0000a158,in_stack_0000a250,in_stack_0000a258,
             in_stack_0000a260,in_stack_0000a268,in_stack_0000a270,in_stack_0000a278,
             in_stack_0000a280,in_stack_0000a288);
  local_a8 = (undefined8 *)(in_stack_00000008 << 1);
  local_b0 = (undefined8 *)(in_R9 << 1);
  for (local_b8 = 0; local_b8 < in_stack_00000010 * in_stack_00000018 >> 3; local_b8 = local_b8 + 1)
  {
    uVar1 = *local_b0;
    uVar2 = local_b0[1];
    uVar3 = *local_a8;
    uVar4 = local_a8[1];
    local_38 = (undefined2)uVar1;
    uStack_36 = (undefined2)((ulong)uVar1 >> 0x10);
    uStack_34 = (undefined2)((ulong)uVar1 >> 0x20);
    uStack_32 = (undefined2)((ulong)uVar1 >> 0x30);
    uStack_30 = (undefined2)uVar2;
    uStack_2e = (undefined2)((ulong)uVar2 >> 0x10);
    uStack_2c = (undefined2)((ulong)uVar2 >> 0x20);
    uStack_2a = (undefined2)((ulong)uVar2 >> 0x30);
    local_48 = (undefined2)uVar3;
    uStack_46 = (undefined2)((ulong)uVar3 >> 0x10);
    uStack_44 = (undefined2)((ulong)uVar3 >> 0x20);
    uStack_42 = (undefined2)((ulong)uVar3 >> 0x30);
    uStack_40 = (undefined2)uVar4;
    uStack_3e = (undefined2)((ulong)uVar4 >> 0x10);
    uStack_3c = (undefined2)((ulong)uVar4 >> 0x20);
    uStack_3a = (undefined2)((ulong)uVar4 >> 0x30);
    uVar5 = pavgw(local_38,local_48);
    uVar6 = pavgw(uStack_36,uStack_46);
    uVar7 = pavgw(uStack_34,uStack_44);
    uVar8 = pavgw(uStack_32,uStack_42);
    uVar9 = pavgw(uStack_30,uStack_40);
    uVar10 = pavgw(uStack_2e,uStack_3e);
    uVar11 = pavgw(uStack_2c,uStack_3c);
    uVar12 = pavgw(uStack_2a,uStack_3a);
    *local_b0 = CONCAT26(uVar8,CONCAT24(uVar7,CONCAT22(uVar6,uVar5)));
    local_b0[1] = CONCAT26(uVar12,CONCAT24(uVar11,CONCAT22(uVar10,uVar9)));
    local_b0 = local_b0 + 2;
    local_a8 = local_a8 + 2;
  }
  return;
}

Assistant:

void aom_highbd_comp_avg_upsampled_pred_sse2(
    MACROBLOCKD *xd, const struct AV1Common *const cm, int mi_row, int mi_col,
    const MV *const mv, uint8_t *comp_pred8, const uint8_t *pred8, int width,
    int height, int subpel_x_q3, int subpel_y_q3, const uint8_t *ref8,
    int ref_stride, int bd, int subpel_search) {
  aom_highbd_upsampled_pred(xd, cm, mi_row, mi_col, mv, comp_pred8, width,
                            height, subpel_x_q3, subpel_y_q3, ref8, ref_stride,
                            bd, subpel_search);
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *comp_pred16 = CONVERT_TO_SHORTPTR(comp_pred8);
  /*The total number of pixels must be a multiple of 8 (e.g., 4x4).*/
  assert(!(width * height & 7));
  int n = width * height >> 3;
  for (int i = 0; i < n; i++) {
    __m128i s0 = _mm_loadu_si128((const __m128i *)comp_pred16);
    __m128i p0 = _mm_loadu_si128((const __m128i *)pred);
    _mm_storeu_si128((__m128i *)comp_pred16, _mm_avg_epu16(s0, p0));
    comp_pred16 += 8;
    pred += 8;
  }
}